

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCssScanner_Generated::handleCommentStart(QCssScanner_Generated *this)

{
  bool bVar1;
  qsizetype qVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar *in_stack_ffffffffffffffc8;
  uint7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar3;
  QString *this_00;
  QChar local_10;
  char16_t local_e;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    this_00 = (QString *)in_RDI[1].d.d;
    qVar2 = QString::size(in_RDI);
    if (qVar2 + -1 <= (long)this_00) {
LAB_00a2d0e9:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return 1;
    }
    local_a = (char16_t)
              QString::at(this_00,CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
    QChar::QChar<char16_t,_true>(&local_c,L'*');
    bVar1 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
    uVar3 = false;
    if (bVar1) {
      local_e = (char16_t)QString::at(this_00,(ulong)in_stack_ffffffffffffffd0);
      QChar::QChar<char16_t,_true>(&local_10,L'/');
      uVar3 = ::operator==((QChar *)CONCAT17(uVar3,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8);
    }
    if ((bool)uVar3 != false) {
      in_RDI[1].d.d =
           (Data *)((long)&((in_RDI[1].d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 2);
      goto LAB_00a2d0e9;
    }
    in_RDI[1].d.d =
         (Data *)((long)&((in_RDI[1].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1);
    in_stack_ffffffffffffffd7 = 0;
  } while( true );
}

Assistant:

int QCssScanner_Generated::handleCommentStart()
{
    while (pos < input.size() - 1) {
        if (input.at(pos) == u'*' && input.at(pos + 1) == u'/') {
            pos += 2;
            break;
        }
        ++pos;
    }
    return S;
}